

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomFourAction.cpp
# Opt level: O1

ActionResults * __thiscall BlueRoomFourAction::Look(BlueRoomFourAction *this)

{
  itemType iVar1;
  ActionResults *this_00;
  string information;
  undefined1 *local_60;
  char *local_58;
  undefined1 local_50 [16];
  string local_40;
  
  local_58 = (char *)0x0;
  local_50[0] = 0;
  local_60 = local_50;
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 - ROPE < 3) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_60,0,local_58,
               (ulong)(&DAT_0012a4a8 + *(int *)(&DAT_0012a4a8 + (ulong)(iVar1 - ROPE) * 4)));
    this_00 = (ActionResults *)operator_new(0x30);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,local_60,local_58 + (long)local_60);
    ActionResults::ActionResults(this_00,CURRENT,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  else {
    this_00 = AbstractRoomAction::Look(&this->super_AbstractRoomAction);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return this_00;
}

Assistant:

ActionResults *BlueRoomFourAction::Look() {

    std::string information;

    switch(commands->getMainItem()) {
        case ROPE:
            information = "The rope appears to be attached to the floor in the middle of the room. There seems to be enough to extend toward each pillar.";
            break;
        case WHITE_PILLAR:
            information = "There appears to be a small hook near the middle of the pillar. Maybe you could tie something to it.";
            break;
        case BLACK_PILLAR:
            information = "There appears to be a small hook near the middle of the pillar. Maybe you could tie something to it.";
            break;
        default:
            return AbstractRoomAction::Look();
    }
    return new ActionResults(CURRENT, information);
}